

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatbase.c
# Opt level: O2

int ecx_BWR(ecx_portt *port,uint16 ADP,uint16 ADO,uint16 length,void *data,int timeout)

{
  uint uVar1;
  int iVar2;
  uint idx;
  
  uVar1 = ecx_getindex(port);
  idx = uVar1 & 0xff;
  ecx_setupdatagram(port,port->txbuf + idx,'\b',(uint8)uVar1,ADP,ADO,length,data);
  iVar2 = ecx_srconfirm(port,idx,timeout);
  ecx_setbufstat(port,idx,0);
  return iVar2;
}

Assistant:

int ecx_BWR (ecx_portt *port, uint16 ADP, uint16 ADO, uint16 length, void *data, int timeout)
{
   uint8 idx;
   int wkc;

   /* get fresh index */
   idx = ecx_getindex (port);
   /* setup datagram */
   ecx_setupdatagram (port, &(port->txbuf[idx]), EC_CMD_BWR, idx, ADP, ADO, length, data);
   /* send data and wait for answer */
   wkc = ecx_srconfirm (port, idx, timeout);
   /* clear buffer status */
   ecx_setbufstat (port, idx, EC_BUF_EMPTY);

   return wkc;
}